

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

bool tinyusdz::value::UpcastType(string *reqType,Value *inout)

{
  half hVar1;
  half hVar2;
  value_type_conflict3 vVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  storage_t<std::array<tinyusdz::value::half,_4UL>_> sVar6;
  bool bVar7;
  value_type_conflict3 *pvVar8;
  value_type *pvVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  storage_t<unsigned_int> sVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  optional<tinyusdz::value::half> pv_1;
  optional<unsigned_int> pv;
  undefined1 local_7c [2];
  storage_t<std::array<tinyusdz::value::half,_4UL>_> local_7a;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_72;
  undefined8 local_68;
  undefined1 local_58 [4];
  storage_t<unsigned_int> sStack_54;
  undefined8 uStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  TryGetUnderlyingTypeId((optional<unsigned_int> *)local_7c,reqType);
  local_58[0] = local_7c[0];
  if (local_7c[0] != (allocator)0x0) {
    sStack_54 = (storage_t<unsigned_int>)local_7a._2_4_;
    pvVar8 = nonstd::optional_lite::optional<unsigned_int>::value
                       ((optional<unsigned_int> *)local_58);
    vVar3 = *pvVar8;
    std::__cxx11::string::string((string *)local_58,"[]",(allocator *)local_7c);
    bVar7 = endsWith(reqType,(string *)local_58);
    std::__cxx11::string::_M_dispose();
    if (!bVar7) {
      switch(vVar3) {
      case 0x28:
        Value::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          local_7a.data.__align =
               (anon_struct_2_0_00000001_for___align)local_72.contained.data._0_2_;
          pvVar9 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                             ((optional<tinyusdz::value::half> *)local_7c);
          fVar14 = half_to_float((half)pvVar9->value);
          local_58 = (undefined1  [4])fVar14;
          linb::any::operator=(&inout->v_,(float *)local_58);
          return true;
        }
        break;
      case 0x29:
        Value::get_value<std::array<tinyusdz::value::half,2ul>>
                  ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_58,inout,false);
        local_7c[0] = local_58[0];
        if (local_58[0] == (allocator)0x1) {
          local_7a._0_4_ = stack0xffffffffffffffaa;
          pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_7c);
          uVar4 = *(undefined4 *)pvVar11->_M_elems;
          fVar14 = half_to_float((half)(uint16_t)uVar4);
          local_58 = (undefined1  [4])fVar14;
          sVar13 = (storage_t<unsigned_int>)half_to_float((half)(uint16_t)((uint)uVar4 >> 0x10));
          sStack_54 = sVar13;
          linb::any::operator=(&inout->v_,(array<float,_2UL> *)local_58);
          return true;
        }
        break;
      case 0x2a:
        Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          local_7a._4_2_ = local_72.contained._4_2_;
          local_7a._2_2_ = local_72.contained._2_2_;
          local_7a.data.__align =
               (anon_struct_2_0_00000001_for___align)local_72.contained.data._0_2_;
          pvVar12 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_7c);
          hVar1.value = pvVar12->_M_elems[1].value;
          hVar2.value = pvVar12->_M_elems[2].value;
          fVar14 = half_to_float((half)pvVar12->_M_elems[0].value);
          local_58 = (undefined1  [4])fVar14;
          sVar13 = (storage_t<unsigned_int>)half_to_float(hVar1);
          sStack_54 = sVar13;
          fVar14 = half_to_float(hVar2);
          uStack_50 = (double)CONCAT44(uStack_50._4_4_,fVar14);
          linb::any::operator=(&inout->v_,(array<float,_3UL> *)local_58);
          return true;
        }
        break;
      case 0x2b:
        Value::get_value<std::array<tinyusdz::value::half,4ul>>(&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          pvVar10 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_7c);
          uVar5 = *(undefined8 *)pvVar10->_M_elems;
          fVar14 = half_to_float((half)(uint16_t)uVar5);
          local_58 = (undefined1  [4])fVar14;
          sVar13 = (storage_t<unsigned_int>)half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x10));
          sStack_54 = sVar13;
          fVar14 = half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x20));
          uStack_50 = (double)CONCAT44(uStack_50._4_4_,fVar14);
          fVar14 = half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x30));
          uStack_50 = (double)CONCAT44(fVar14,(float)uStack_50);
          linb::any::operator=(&inout->v_,(array<float,_4UL> *)local_58);
          return true;
        }
        break;
      case 0x2c:
        Value::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          local_7a.data.__align =
               (anon_struct_2_0_00000001_for___align)local_72.contained.data._0_2_;
          pvVar9 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                             ((optional<tinyusdz::value::half> *)local_7c);
          fVar14 = half_to_float((half)pvVar9->value);
          _local_58 = (optional<unsigned_int>)(double)fVar14;
          linb::any::operator=(&inout->v_,(double *)local_58);
          return true;
        }
        break;
      case 0x2d:
        Value::get_value<std::array<tinyusdz::value::half,2ul>>
                  ((optional<std::array<tinyusdz::value::half,_2UL>_> *)&local_72,inout,false);
        sVar6 = local_7a;
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          local_7a._2_2_ = local_72.contained._2_2_;
          local_7a.data.__align =
               (anon_struct_2_0_00000001_for___align)local_72.contained.data._0_2_;
          local_7a._4_4_ = sVar6._4_4_;
          pvVar11 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_7c);
          uVar4 = *(undefined4 *)pvVar11->_M_elems;
          fVar14 = half_to_float((half)(uint16_t)uVar4);
          local_68 = CONCAT44(extraout_XMM0_Db_01,fVar14);
          fVar14 = half_to_float((half)(uint16_t)((uint)uVar4 >> 0x10));
          _local_58 = (optional<unsigned_int>)(double)(float)local_68;
          uStack_50 = (double)fVar14;
          linb::any::operator=(&inout->v_,(array<double,_2UL> *)local_58);
          return true;
        }
        break;
      case 0x2e:
        Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          local_7a._4_2_ = local_72.contained._4_2_;
          local_7a._2_2_ = local_72.contained._2_2_;
          local_7a.data.__align =
               (anon_struct_2_0_00000001_for___align)local_72.contained.data._0_2_;
          pvVar12 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_7c);
          hVar1.value = pvVar12->_M_elems[1].value;
          hVar2.value = pvVar12->_M_elems[2].value;
          fVar14 = half_to_float((half)pvVar12->_M_elems[0].value);
          local_68 = CONCAT44(extraout_XMM0_Db_02,fVar14);
          fVar14 = half_to_float(hVar1);
          _local_58 = (optional<unsigned_int>)(double)(float)local_68;
          uStack_50 = (double)fVar14;
          fVar14 = half_to_float(hVar2);
          local_48._M_allocated_capacity = (size_type)(double)fVar14;
          linb::any::operator=(&inout->v_,(array<double,_3UL> *)local_58);
          return true;
        }
        break;
      case 0x2f:
        Value::get_value<std::array<tinyusdz::value::half,4ul>>(&local_72,inout,false);
        local_7c[0] = (allocator)local_72.has_value_;
        if ((allocator)local_72.has_value_ == (allocator)0x1) {
          pvVar10 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                              ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_7c);
          uVar5 = *(undefined8 *)pvVar10->_M_elems;
          fVar14 = half_to_float((half)(uint16_t)uVar5);
          local_68 = CONCAT44(extraout_XMM0_Db,fVar14);
          fVar14 = half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x10));
          _local_58 = (optional<unsigned_int>)(double)(float)local_68;
          uStack_50 = (double)fVar14;
          fVar14 = half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x20));
          local_68 = CONCAT44(extraout_XMM0_Db_00,fVar14);
          fVar14 = half_to_float((half)(uint16_t)((ulong)uVar5 >> 0x30));
          local_48._M_allocated_capacity = (size_type)(double)(float)local_68;
          local_48._8_8_ = (undefined8)fVar14;
          linb::any::operator=(&inout->v_,(array<double,_4UL> *)local_58);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool UpcastType(const std::string &reqType, value::Value &inout) {
  // `reqType` may be Role type. Get underlying type
  uint32_t tyid;
  if (auto pv = value::TryGetUnderlyingTypeId(reqType)) {
    tyid = pv.value();
  } else {
    // Invalid reqType.
    return false;
  }

  bool reqTypeArray = false;
  //uint32_t baseReqTyId;
  DCOUT("UpcastType trial: reqTy : " << reqType
                                     << ", valtype = " << inout.type_name());

  if (endsWith(reqType, "[]")) {
    reqTypeArray = true;
    //baseReqTyId = value::GetTypeId(removeSuffix(reqType, "[]"));
  } else {
    //baseReqTyId = value::GetTypeId(reqType);
  }
  DCOUT("is array: " << reqTypeArray);

  // For array
  if (reqTypeArray) {
    // TODO
  } else {
    if (tyid == value::TYPE_ID_FLOAT) {
      float dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = half_to_float(pv.value());
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT2) {
      if (auto pv = inout.get_value<value::half2>()) {
        value::float2 dst;
        value::half2 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        inout = dst;
        return true;
      }

    } else if (tyid == value::TYPE_ID_FLOAT3) {
      value::float3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT4) {
      value::float4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        dst[3] = half_to_float(v[3]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE) {
      double dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = double(half_to_float(pv.value()));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE2) {
      value::double2 dst;
      if (auto pv = inout.get_value<value::half2>()) {
        value::half2 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE3) {
      value::double3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE4) {
      value::double4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        dst[3] = double(half_to_float(v[3]));
        inout = dst;
        return true;
      }
    }
  }

  return false;
}